

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QRingChunk>::begin(QList<QRingChunk> *this)

{
  QRingChunk *n;
  QArrayDataPointer<QRingChunk> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QRingChunk> *)0x168349);
  QArrayDataPointer<QRingChunk>::operator->(in_RDI);
  n = QArrayDataPointer<QRingChunk>::begin((QArrayDataPointer<QRingChunk> *)0x16835a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }